

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreListCountListUsed(Gia_ManAre_t *p,Gia_PtrAre_t Root)

{
  int iVar1;
  undefined4 local_24;
  Gia_StaAre_t *pGStack_20;
  int Counter;
  Gia_StaAre_t *pCube;
  Gia_ManAre_t *p_local;
  Gia_PtrAre_t Root_local;
  
  local_24 = 0;
  pGStack_20 = Gia_ManAreSta(p,Root);
  while( true ) {
    iVar1 = Gia_StaIsGood(p,pGStack_20);
    if (iVar1 == 0) break;
    iVar1 = Gia_StaIsUsed(pGStack_20);
    local_24 = iVar1 + local_24;
    pGStack_20 = Gia_StaNext(p,pGStack_20);
  }
  return local_24;
}

Assistant:

static inline int Gia_ManAreListCountListUsed( Gia_ManAre_t * p, Gia_PtrAre_t Root )
{
    Gia_StaAre_t * pCube;
    int Counter = 0;
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, Root), pCube )
        Counter += Gia_StaIsUsed(pCube);
    return Counter;
}